

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O1

REF_STATUS ref_interp_push_onto_queue(REF_INTERP ref_interp,REF_INT node)

{
  int node_00;
  REF_NODE pRVar1;
  REF_INT *pRVar2;
  REF_AGENT_STRUCT *pRVar3;
  uint uVar4;
  long lVar5;
  undefined8 uVar6;
  REF_AGENTS ref_agents;
  char *pcVar7;
  long lVar8;
  long lVar9;
  REF_INT id;
  REF_INT nneighbor;
  REF_INT neighbors [200];
  int local_36c;
  uint local_368;
  int local_364;
  REF_AGENTS local_360;
  REF_INT local_358 [202];
  
  if (-1 < node) {
    pRVar1 = ref_interp->to_grid->node;
    if ((node < pRVar1->max) && (-1 < pRVar1->global[(uint)node])) {
      if (pRVar1->ref_mpi->id == pRVar1->part[(uint)node]) {
        if (ref_interp->cell[(uint)node] != -1) {
          ref_agents = ref_interp->ref_agents;
          uVar4 = ref_grid_node_list_around(ref_interp->to_grid,node,200,&local_364,local_358);
          if ((uVar4 != 0) && (uVar4 != 7)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0x330,"ref_interp_push_onto_queue",(ulong)uVar4,"neighbors");
            return uVar4;
          }
          if (local_364 < 1) {
            return 0;
          }
          lVar9 = 0;
          local_368 = uVar4;
          local_360 = ref_agents;
          do {
            node_00 = local_358[lVar9];
            lVar8 = (long)node_00;
            if (pRVar1->ref_mpi->id == pRVar1->part[lVar8]) {
              pRVar2 = ref_interp->cell;
              if ((pRVar2[lVar8] == -1) && (ref_interp->agent_hired[lVar8] == 0)) {
                ref_interp->agent_hired[lVar8] = 1;
                uVar4 = ref_agents_push(ref_agents,node_00,ref_interp->part[(uint)node],
                                        pRVar2[(uint)node],pRVar1->real + lVar8 * 0xf,&local_36c);
                ref_agents = local_360;
                if (uVar4 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                         ,0x33a,"ref_interp_push_onto_queue",(ulong)uVar4,"enque");
                  return uVar4;
                }
              }
            }
            else {
              uVar4 = ref_agents_push(ref_agents,node_00,ref_interp->part[(uint)node],
                                      ref_interp->cell[(uint)node],pRVar1->real + lVar8 * 0xf,
                                      &local_36c);
              if (uVar4 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                       ,0x340,"ref_interp_push_onto_queue",(ulong)uVar4,"enque");
                return uVar4;
              }
              pRVar3 = local_360->agent;
              pRVar3[local_36c].mode = REF_AGENT_SUGGESTION;
              pRVar3[local_36c].node = -1;
              pRVar3[local_36c].home = pRVar1->part[lVar8];
              lVar5 = -1;
              if (((-1 < node_00) && (node_00 < pRVar1->max)) &&
                 (lVar5 = pRVar1->global[lVar8], lVar5 < 0)) {
                lVar5 = -1;
              }
              pRVar3[local_36c].global = lVar5;
              ref_agents = local_360;
            }
            lVar9 = lVar9 + 1;
          } while (lVar9 < local_364);
          return 0;
        }
        pcVar7 = "no cell for guess";
        uVar6 = 0x32c;
      }
      else {
        pcVar7 = "ghost node";
        uVar6 = 0x32a;
      }
      goto LAB_0011dde6;
    }
  }
  pcVar7 = "invalid node";
  uVar6 = 0x329;
LAB_0011dde6:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar6,
         "ref_interp_push_onto_queue",pcVar7);
  return 1;
}

Assistant:

REF_FCN static REF_STATUS ref_interp_push_onto_queue(REF_INTERP ref_interp,
                                                     REF_INT node) {
  REF_GRID ref_grid = ref_interp_to_grid(ref_interp);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_AGENTS ref_agents = ref_interp->ref_agents;
  REF_INT neighbor, nneighbor, neighbors[MAX_NODE_LIST];
  REF_INT id, other;

  RAS(ref_node_valid(ref_node, node), "invalid node");
  RAS(ref_node_owned(ref_node, node), "ghost node");

  RUS(REF_EMPTY, ref_interp->cell[node], "no cell for guess");

  RXS(ref_grid_node_list_around(ref_grid, node, MAX_NODE_LIST, &nneighbor,
                                neighbors),
      REF_INCREASE_LIMIT, "neighbors");
  for (neighbor = 0; neighbor < nneighbor; neighbor++) {
    other = neighbors[neighbor];
    if (ref_node_owned(ref_node, other)) {
      if (ref_interp->cell[other] == REF_EMPTY &&
          !(ref_interp->agent_hired[other])) {
        ref_interp->agent_hired[other] = REF_TRUE;
        RSS(ref_agents_push(ref_agents, other, ref_interp->part[node],
                            ref_interp->cell[node],
                            ref_node_xyz_ptr(ref_node, other), &id),
            "enque");
      }
    } else { /* add ghost seeding via REF_AGENT_SUGGESTION mode */
      RSS(ref_agents_push(ref_agents, other, ref_interp->part[node],
                          ref_interp->cell[node],
                          ref_node_xyz_ptr(ref_node, other), &id),
          "enque");
      ref_agent_mode(ref_agents, id) = REF_AGENT_SUGGESTION;
      ref_agent_node(ref_agents, id) = REF_EMPTY;
      ref_agent_home(ref_agents, id) = ref_node_part(ref_node, other);
      ref_agent_global(ref_agents, id) = ref_node_global(ref_node, other);
    }
  }

  return REF_SUCCESS;
}